

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::UnaryUpdate<duckdb::SkewState,double,duckdb::SkewnessOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  double dVar1;
  unsigned_long *puVar2;
  long lVar3;
  FunctionData *pFVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  AggregateUnaryInput input_data;
  undefined1 local_d8 [96];
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar5 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar6 = 0;
      uVar9 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = *(ulong *)(*(long *)(input + 0x28) + uVar6 * 8);
        }
        uVar7 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar10 != 0) {
          uVar8 = uVar9;
          if (uVar10 == 0xffffffffffffffff) {
            lVar11 = uVar7 - uVar9;
            if (uVar9 <= uVar7 && lVar11 != 0) {
              lVar3 = *(long *)state;
              dVar13 = *(double *)(state + 8);
              dVar14 = *(double *)(state + 0x10);
              dVar12 = *(double *)(state + 0x18);
              do {
                dVar1 = *(double *)(lVar5 + uVar9 * 8);
                dVar13 = dVar13 + dVar1;
                dVar14 = dVar14 + dVar1 * dVar1;
                dVar1 = pow(dVar1,3.0);
                dVar12 = dVar12 + dVar1;
                uVar9 = uVar9 + 1;
              } while (uVar7 != uVar9);
              *(long *)state = lVar11 + lVar3;
              *(double *)(state + 8) = dVar13;
              *(double *)(state + 0x10) = dVar14;
              *(double *)(state + 0x18) = dVar12;
              uVar8 = uVar9;
            }
          }
          else if (uVar9 < uVar7) {
            uVar8 = 0;
            do {
              if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                dVar12 = *(double *)(lVar5 + uVar9 * 8 + uVar8 * 8);
                *(double *)(state + 8) = dVar12 + *(double *)(state + 8);
                *(double *)(state + 0x10) = dVar12 * dVar12 + *(double *)(state + 0x10);
                dVar12 = pow(dVar12,3.0);
                *(double *)(state + 0x18) = dVar12 + *(double *)(state + 0x18);
              }
              uVar8 = uVar8 + 1;
            } while ((uVar9 - uVar7) + uVar8 != 0);
            uVar8 = uVar9 + uVar8;
          }
        }
        uVar6 = uVar6 + 1;
        uVar9 = uVar8;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      SkewnessOperation::ConstantOperation<double,duckdb::SkewState,duckdb::SkewnessOperation>
                ((SkewState *)state,*(double **)(input + 0x20),&local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar4 = ((local_78.input)->bind_data).ptr;
        lVar5 = *(long *)state;
        local_d8._0_16_ = *(undefined1 (*) [16])(state + 8);
        dVar12 = *(double *)(state + 0x18);
        uVar9 = 0;
        do {
          uVar6 = uVar9;
          if (pFVar4 != (FunctionData *)0x0) {
            uVar6 = (ulong)*(uint *)(pFVar4 + uVar9 * 4);
          }
          puVar2 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[uVar6];
          dVar14 = (double)local_d8._0_8_ + (double)puVar2;
          dVar13 = (double)local_d8._8_8_ + (double)puVar2 * (double)puVar2;
          local_d8._8_4_ = SUB84(dVar13,0);
          local_d8._0_8_ = dVar14;
          local_d8._12_4_ = (int)((ulong)dVar13 >> 0x20);
          dVar13 = pow((double)puVar2,3.0);
          dVar12 = dVar12 + dVar13;
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
        *(idx_t *)state = lVar5 + count;
        *(double *)(state + 8) = dVar14;
        *(undefined8 *)(state + 0x10) = local_d8._8_8_;
        *(double *)(state + 0x18) = dVar12;
      }
    }
    else if (count != 0) {
      pFVar4 = ((local_78.input)->bind_data).ptr;
      uVar9 = 0;
      do {
        uVar6 = uVar9;
        if (pFVar4 != (FunctionData *)0x0) {
          uVar6 = (ulong)*(uint *)(pFVar4 + uVar9 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
          *(long *)state = *(long *)state + 1;
          puVar2 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[uVar6];
          *(double *)(state + 8) = (double)puVar2 + *(double *)(state + 8);
          *(double *)(state + 0x10) = (double)puVar2 * (double)puVar2 + *(double *)(state + 0x10);
          dVar12 = pow((double)puVar2,3.0);
          *(double *)(state + 0x18) = dVar12 + *(double *)(state + 0x18);
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}